

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_aux_mesh.cxx
# Opt level: O2

void __thiscall
level_aux_mesh::compact_vertices<xray_re::hom_poly>
          (level_aux_mesh *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *refs,
          hom_poly *faces)

{
  vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_> *this_00;
  float fVar1;
  uint *puVar2;
  pointer pbVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  uint *puVar8;
  uint32_t uVar9;
  anon_union_12_2_77b31271_for__vector3<float>_1 local_40;
  
  std::
  __sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_comp_iter<vertex_less<xray_re::hom_poly>>>
            ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )(refs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )(refs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish,
             (_Iter_comp_iter<vertex_less<xray_re::hom_poly>_>)faces);
  this_00 = &(this->super_xr_mesh_builder).super_xr_mesh.m_points;
  std::vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>::reserve
            (this_00,(long)(refs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)(refs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                           _M_impl.super__Vector_impl_data._M_start >> 2);
  uVar4 = ((long)(this->super_xr_mesh_builder).super_xr_mesh.m_points.
                 super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->super_xr_mesh_builder).super_xr_mesh.m_points.
                super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0xc;
  puVar8 = (refs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (refs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  do {
    if (puVar8 == puVar2) {
      return;
    }
    uVar9 = (uint32_t)uVar4;
    (this->super_xr_mesh_builder).m_faces.
    super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
    ._M_impl.super__Vector_impl_data._M_start[*puVar8 >> 2].field_0.__refs[*puVar8 & 3] = uVar9;
    uVar6 = *puVar8 >> 2;
    lVar5 = (ulong)(*puVar8 & 3) * 0xc;
    local_40._0_8_ = *(undefined8 *)((long)&faces[uVar6].field_0 + lVar5);
    local_40.field_0.z = *(float *)((long)&faces[uVar6].field_0 + lVar5 + 8);
    std::vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>::push_back
              (this_00,(value_type *)&local_40.field_0);
    pbVar3 = (this->super_xr_mesh_builder).m_faces.
             super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
             ._M_impl.super__Vector_impl_data._M_start;
    while (puVar8 = puVar8 + 1, puVar8 != puVar2) {
      uVar6 = *puVar8;
      uVar7 = uVar6 >> 2;
      lVar5 = (ulong)(uVar6 & 3) * 0xc;
      fVar1 = *(float *)((long)&faces[uVar7].field_0 + lVar5);
      if ((fVar1 != local_40.field_0.x) || (NAN(fVar1) || NAN(local_40.field_0.x))) break;
      fVar1 = *(float *)((long)&faces[uVar7].field_0 + lVar5 + 4);
      if ((fVar1 != local_40.field_0.y) ||
         (((NAN(fVar1) || NAN(local_40.field_0.y) ||
           (fVar1 = *(float *)((long)&faces[uVar7].field_0 + lVar5 + 8), fVar1 != local_40.field_0.z
           )) || (NAN(fVar1) || NAN(local_40.field_0.z))))) break;
      pbVar3[uVar6 >> 2].field_0.__refs[uVar6 & 3] = uVar9;
    }
    uVar4 = (ulong)(uVar9 + 1);
  } while( true );
}

Assistant:

void level_aux_mesh::compact_vertices(std::vector<uint32_t>& refs, const T* faces)
{
	std::sort(refs.begin(), refs.end(), vertex_less<T>(faces));
	m_points.reserve(refs.size());
	fvector3 p;
	uint32_t point_idx = uint32_t(m_points.size() & UINT32_MAX);
	for (std::vector<uint32_t>::iterator it = refs.begin(), end = refs.end(); it != end; ++point_idx) {
		vertex_point(*it) = point_idx;
		m_points.push_back(p.set(face_vertex<T>(faces, *it)));
		while(++it != end && face_vertex<T>(faces, *it) == p)
			vertex_point(*it) = point_idx;
	}
}